

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

ktx_error_code_e anon_unknown.dwarf_59e0::StreambufStream::getpos(ktxStream *str,ktx_off_t *offset)

{
  pointer pbVar1;
  streamoff sVar2;
  ostream *this;
  void *this_00;
  long *in_RSI;
  ktxStream *in_RDI;
  StreambufStream *self;
  fpos local_28 [16];
  StreambufStream *local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18 = parent(in_RDI);
  pbVar1 = std::
           unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                         *)0x10da9b);
  local_28 = (fpos  [16])std::streambuf::pubseekoff((long)pbVar1,_S_beg,_S_app);
  sVar2 = std::fpos::operator_cast_to_long(local_28);
  *local_10 = sVar2;
  this = std::operator<<((ostream *)&std::cerr,"\tgetpos: ");
  this_00 = (void *)std::ostream::operator<<(this,*local_10);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code getpos(ktxStream* str, ktx_off_t *offset)
    {
        auto self = parent(str);
        *offset = ktx_off_t(self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode));
        std::cerr << "\tgetpos: " << *offset << std::endl;
        return KTX_SUCCESS;
    }